

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O2

pair<double,_double>
Function_Template::template_LookupTable
          (LookupTableForm2 LookupTable,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  uint32_t i;
  uint uVar2;
  pair<double,_double> pVar3;
  allocator_type local_89;
  double local_88;
  double local_80;
  TimerContainer timer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> table;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  
  Test_Helper::uniformImages(&image,2,size,size);
  timer.super_BaseTimerContainer._time.super__List_base<double,_std::allocator<double>_>._M_impl.
  _M_node.super__List_node_base._M_next._0_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&table,0x100,(value_type_conflict3 *)&timer,&local_89);
  SetupFunction(namespaceName);
  Performance_Test::TimerContainer::TimerContainer(&timer);
  uVar2 = 0;
  while( true ) {
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= uVar2) break;
    Performance_Test::TimerContainer::start(&timer);
    (*LookupTable)(image.
                   super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   image.
                   super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1,&table);
    Performance_Test::TimerContainer::stop(&timer);
    uVar2 = uVar2 + 1;
  }
  CleanupFunction(namespaceName);
  pVar3 = Performance_Test::BaseTimerContainer::mean(&timer.super_BaseTimerContainer);
  local_88 = pVar3.second;
  local_80 = pVar3.first;
  Performance_Test::TimerContainer::~TimerContainer(&timer.super_BaseTimerContainer);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&table.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&image);
  pVar3.second = local_88;
  pVar3.first = local_80;
  return pVar3;
}

Assistant:

std::pair < double, double > template_LookupTable( LookupTableForm2 LookupTable, const std::string & namespaceName, uint32_t size )
    {
        std::vector < PenguinV_Image::Image > image = Performance_Test::uniformImages( 2, size, size );
        std::vector<uint8_t> table(256, 0);

        TEST_FUNCTION_LOOP( LookupTable( image[0], image[1], table ), namespaceName )
    }